

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::SetSpecial(CNetAddr *this,string *addr)

{
  long lVar1;
  string_view str;
  bool bVar2;
  size_t in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  string *in_stack_00000048;
  CNetAddr *in_stack_00000050;
  undefined8 local_30;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(local_30);
  str._M_str = in_RDI;
  str._M_len = in_RSI;
  bVar2 = util::ContainsNoNUL(str);
  if (bVar2) {
    bVar2 = SetTor(in_stack_00000050,in_stack_00000048);
    if (bVar2) {
      local_9 = true;
    }
    else {
      bVar2 = SetI2P(in_stack_00000050,in_stack_00000048);
      if (bVar2) {
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
  }
  else {
    local_9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetSpecial(const std::string& addr)
{
    if (!ContainsNoNUL(addr)) {
        return false;
    }

    if (SetTor(addr)) {
        return true;
    }

    if (SetI2P(addr)) {
        return true;
    }

    return false;
}